

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiMetricsConfig *p_open_00;
  bool *pbVar1;
  int *piVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiWindow **ppIVar5;
  ImGuiViewportP *pIVar6;
  ImGuiPopupData *pIVar7;
  undefined8 *puVar8;
  ImFontAtlas *atlas;
  int iVar9;
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  int iVar13;
  ImGuiContext *g;
  ImGuiTable *pIVar14;
  ImDrawList *pIVar15;
  ImGuiWindow **ppIVar16;
  ImGuiTabBar *tab_bar;
  ImU32 col;
  ImGuiContext *g_9;
  long lVar17;
  ImGuiWindow *pIVar18;
  char *pcVar19;
  long lVar20;
  char *pcVar21;
  int rect_n;
  ulong uVar22;
  ImPool<ImGuiTable> *this;
  ulong uVar23;
  ImGuiWindowSettings *p;
  ImGuiTableSettings *settings;
  bool bVar24;
  int n_1;
  undefined **ppuVar25;
  char **ppcVar26;
  ImGuiWindow **ppIVar27;
  int iVar28;
  ImGuiWindow *window;
  ImVector<ImDrawList_*> *pIVar29;
  uint uVar30;
  ImPoolIdx IVar31;
  ImGuiContext *g_7;
  int n;
  byte bVar32;
  float fVar33;
  float fVar34;
  float extraout_XMM0_Db;
  float fVar35;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar36;
  undefined4 uVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ImRect IVar41;
  ImVec2 local_1b8;
  int *local_1b0;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  int *local_188;
  ImVec2 local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  char buf_1 [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  pIVar10 = GImGui;
  bVar32 = 0;
  p_open_00 = &GImGui->DebugMetricsConfig;
  if ((GImGui->DebugMetricsConfig).ShowDebugLog == true) {
    ShowDebugLogWindow(&p_open_00->ShowDebugLog);
  }
  pbVar1 = &(pIVar10->DebugMetricsConfig).ShowStackTool;
  if ((pIVar10->DebugMetricsConfig).ShowStackTool == true) {
    ShowStackToolWindow(pbVar1);
  }
  bVar12 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  if ((!bVar12) ||
     (pIVar18 = GImGui->CurrentWindow, pIVar18->WriteAccessed = true, 1 < pIVar18->BeginCount)) {
    End();
    return;
  }
  Text("Dear ImGui %s","1.88");
  uVar36 = 0;
  uVar37 = 0;
  Text("Application average %.3f ms/frame (%.1f FPS)",
       SUB84((double)(1000.0 / (pIVar10->IO).Framerate),0));
  iVar13 = (pIVar10->IO).MetricsRenderIndices;
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar10->IO).MetricsRenderVertices,
       (long)iVar13,(ulong)(uint)(iVar13 / 3));
  Text("%d visible windows, %d active allocations",(ulong)(uint)(pIVar10->IO).MetricsRenderWindows,
       (ulong)(uint)(pIVar10->IO).MetricsActiveAllocations);
  Separator();
  wrt_rects_names[6] = "ContentIdeal";
  wrt_rects_names[7] = "ContentRegionRect";
  wrt_rects_names[4] = "WorkRect";
  wrt_rects_names[5] = "Content";
  wrt_rects_names[2] = "InnerRect";
  wrt_rects_names[3] = "InnerClipRect";
  wrt_rects_names[0] = "OuterRect";
  wrt_rects_names[1] = "OuterRectClipped";
  ppuVar25 = &PTR_anon_var_dwarf_c29fa_001e1370;
  ppcVar26 = trt_rects_names;
  for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
    *ppcVar26 = *ppuVar25;
    ppuVar25 = ppuVar25 + (ulong)bVar32 * -2 + 1;
    ppcVar26 = ppcVar26 + (ulong)bVar32 * -2 + 1;
  }
  local_188 = &(pIVar10->DebugMetricsConfig).ShowWindowsRectsType;
  if ((pIVar10->DebugMetricsConfig).ShowWindowsRectsType < 0) {
    *local_188 = 4;
  }
  local_1b0 = &(pIVar10->DebugMetricsConfig).ShowTablesRectsType;
  if ((pIVar10->DebugMetricsConfig).ShowTablesRectsType < 0) {
    *local_1b0 = 2;
  }
  bVar12 = TreeNode("Tools");
  if (bVar12) {
    bVar12 = TreeNode("UTF-8 Encoding viewer");
    pIVar18 = GImGui->CurrentWindow;
    if (pIVar18->SkipItems == false) {
      (pIVar18->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar18->DC).CursorPosPrevLine.x;
      (pIVar18->DC).CursorPos.y = (pIVar18->DC).CursorPosPrevLine.y;
      (pIVar18->DC).CurrLineSize = (pIVar18->DC).PrevLineSize;
      (pIVar18->DC).CurrLineTextBaseOffset = (pIVar18->DC).PrevLineTextBaseOffset;
      (pIVar18->DC).IsSameLine = true;
    }
    MetricsHelpMarker(
                     "You can also call ImGui::DebugTextEncoding() from your code with a given string to test that your UTF-8 encoding settings are correct."
                     );
    pIVar11 = GImGui;
    if (bVar12) {
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar11->NextItemData).Width = -1.1754944e-38;
      InputText("##Text",ShowMetricsWindow::buf,100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
      if (ShowMetricsWindow::buf[0] != '\0') {
        DebugTextEncoding(ShowMetricsWindow::buf);
      }
      TreePop();
    }
    bVar12 = Checkbox("Show Item Picker",&pIVar10->DebugItemPickerActive);
    pIVar11 = GImGui;
    if ((bVar12) && (pIVar10->DebugItemPickerActive == true)) {
      GImGui->DebugItemPickerActive = true;
    }
    pIVar18 = pIVar11->CurrentWindow;
    if (pIVar18->SkipItems == false) {
      (pIVar18->DC).CursorPos.x = (pIVar11->Style).ItemSpacing.x + (pIVar18->DC).CursorPosPrevLine.x
      ;
      (pIVar18->DC).CursorPos.y = (pIVar18->DC).CursorPosPrevLine.y;
      (pIVar18->DC).CurrLineSize = (pIVar18->DC).PrevLineSize;
      (pIVar18->DC).CurrLineTextBaseOffset = (pIVar18->DC).PrevLineTextBaseOffset;
      (pIVar18->DC).IsSameLine = true;
    }
    MetricsHelpMarker(
                     "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                     );
    Checkbox("Show Debug Log",&p_open_00->ShowDebugLog);
    pIVar18 = GImGui->CurrentWindow;
    if (pIVar18->SkipItems == false) {
      (pIVar18->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar18->DC).CursorPosPrevLine.x;
      (pIVar18->DC).CursorPos.y = (pIVar18->DC).CursorPosPrevLine.y;
      (pIVar18->DC).CurrLineSize = (pIVar18->DC).PrevLineSize;
      (pIVar18->DC).CurrLineTextBaseOffset = (pIVar18->DC).PrevLineTextBaseOffset;
      (pIVar18->DC).IsSameLine = true;
    }
    MetricsHelpMarker("You can also call ImGui::ShowDebugLogWindow() from your code.");
    Checkbox("Show Stack Tool",pbVar1);
    pIVar18 = GImGui->CurrentWindow;
    if (pIVar18->SkipItems == false) {
      (pIVar18->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar18->DC).CursorPosPrevLine.x;
      (pIVar18->DC).CursorPos.y = (pIVar18->DC).CursorPosPrevLine.y;
      (pIVar18->DC).CurrLineSize = (pIVar18->DC).PrevLineSize;
      (pIVar18->DC).CurrLineTextBaseOffset = (pIVar18->DC).PrevLineTextBaseOffset;
      (pIVar18->DC).IsSameLine = true;
    }
    MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");
    Checkbox("Show windows begin order",&(pIVar10->DebugMetricsConfig).ShowWindowsBeginOrder);
    pbVar1 = &(pIVar10->DebugMetricsConfig).ShowWindowsRects;
    Checkbox("Show windows rectangles",pbVar1);
    pIVar11 = GImGui;
    pIVar18 = GImGui->CurrentWindow;
    if (pIVar18->SkipItems == false) {
      (pIVar18->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar18->DC).CursorPosPrevLine.x;
      (pIVar18->DC).CursorPos.y = (pIVar18->DC).CursorPosPrevLine.y;
      (pIVar18->DC).CurrLineSize = (pIVar18->DC).PrevLineSize;
      (pIVar18->DC).CurrLineTextBaseOffset = (pIVar18->DC).PrevLineTextBaseOffset;
      (pIVar18->DC).IsSameLine = true;
    }
    fVar33 = pIVar11->FontSize;
    *(byte *)&(pIVar11->NextItemData).Flags = (byte)(pIVar11->NextItemData).Flags | 1;
    (pIVar11->NextItemData).Width = fVar33 * 12.0;
    bVar12 = Combo("##show_windows_rect_type",local_188,wrt_rects_names,8,8);
    *pbVar1 = (bool)(*pbVar1 | bVar12);
    if ((*pbVar1 != false) && (pIVar10->NavWindow != (ImGuiWindow *)0x0)) {
      lVar17 = 0;
      BulletText("\'%s\':",pIVar10->NavWindow->Name);
      pIVar11 = GImGui;
      pIVar18 = GImGui->CurrentWindow;
      pIVar18->WriteAccessed = true;
      fVar33 = (pIVar11->Style).IndentSpacing + (pIVar18->DC).Indent.x;
      (pIVar18->DC).Indent.x = fVar33;
      (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
      do {
        IVar41 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar10->NavWindow,(int)lVar17);
        uVar36 = 0;
        uVar37 = 0;
        Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar41.Min.x,0),
             SUB84((double)IVar41.Min.y,0),SUB84((double)IVar41.Max.x,0),(double)IVar41.Max.y,
             (double)(IVar41.Max.x - IVar41.Min.x),(double)(IVar41.Max.y - IVar41.Min.y),
             wrt_rects_names[lVar17]);
        pIVar11 = GImGui;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 8);
      pIVar18 = GImGui->CurrentWindow;
      pIVar18->WriteAccessed = true;
      fVar33 = (pIVar18->DC).Indent.x - (pIVar11->Style).IndentSpacing;
      (pIVar18->DC).Indent.x = fVar33;
      (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
    }
    pbVar1 = &(pIVar10->DebugMetricsConfig).ShowTablesRects;
    Checkbox("Show tables rectangles",pbVar1);
    pIVar11 = GImGui;
    pIVar18 = GImGui->CurrentWindow;
    if (pIVar18->SkipItems == false) {
      (pIVar18->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar18->DC).CursorPosPrevLine.x;
      (pIVar18->DC).CursorPos.y = (pIVar18->DC).CursorPosPrevLine.y;
      (pIVar18->DC).CurrLineSize = (pIVar18->DC).PrevLineSize;
      (pIVar18->DC).CurrLineTextBaseOffset = (pIVar18->DC).PrevLineTextBaseOffset;
      (pIVar18->DC).IsSameLine = true;
    }
    fVar33 = pIVar11->FontSize;
    *(byte *)&(pIVar11->NextItemData).Flags = (byte)(pIVar11->NextItemData).Flags | 1;
    (pIVar11->NextItemData).Width = fVar33 * 12.0;
    bVar12 = Combo("##show_table_rects_type",local_1b0,trt_rects_names,0xd,0xd);
    *pbVar1 = (bool)(*pbVar1 | bVar12);
    if (((*pbVar1 != false) && (pIVar10->NavWindow != (ImGuiWindow *)0x0)) &&
       (0 < (pIVar10->Tables).Map.Data.Size)) {
      this = &pIVar10->Tables;
      IVar31 = 0;
      local_178._0_8_ = this;
      do {
        pIVar14 = ImPool<ImGuiTable>::TryGetMapData(this,IVar31);
        if ((pIVar14 != (ImGuiTable *)0x0) && (pIVar10->FrameCount + -1 <= pIVar14->LastFrameActive)
           ) {
          if ((pIVar14->OuterWindow == pIVar10->NavWindow) ||
             (pIVar14->InnerWindow == pIVar10->NavWindow)) {
            local_168._0_4_ = IVar31;
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar14->ID,
                       (ulong)(uint)pIVar14->ColumnsCount,pIVar14->OuterWindow->Name);
            bVar12 = IsItemHovered(0);
            if (bVar12) {
              pIVar15 = GetForegroundDrawList();
              auVar39 = buf_1._0_16_;
              IVar3 = (pIVar14->OuterRect).Min;
              buf_1._4_4_ = IVar3.y + -1.0;
              buf_1._0_4_ = IVar3.x + -1.0;
              buf_1._8_8_ = auVar39._8_8_;
              IVar3 = (pIVar14->OuterRect).Max;
              local_1b8.y = IVar3.y + 1.0;
              local_1b8.x = IVar3.x + 1.0;
              uVar36 = 0;
              uVar37 = 0;
              ImDrawList::AddRect(pIVar15,(ImVec2 *)buf_1,&local_1b8,0xff00ffff,0.0,0,2.0);
            }
            pIVar11 = GImGui;
            pIVar18 = GImGui->CurrentWindow;
            pIVar18->WriteAccessed = true;
            fVar33 = (pIVar11->Style).IndentSpacing + (pIVar18->DC).Indent.x;
            (pIVar18->DC).Indent.x = fVar33;
            (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
            uVar22 = 0;
            do {
              iVar13 = (int)uVar22;
              if (uVar22 < 6) {
                IVar41 = ShowMetricsWindow::Funcs::GetTableRect(pIVar14,iVar13,-1);
                local_198._0_8_ = IVar41.Max;
                local_198._8_4_ = uVar36;
                local_198._12_4_ = uVar37;
                uVar36 = 0;
                uVar37 = 0;
                fStack_1a0 = (float)extraout_XMM0_Dc_00;
                local_1a8._0_4_ = IVar41.Min.x;
                local_1a8._4_4_ = IVar41.Min.y;
                fStack_19c = (float)extraout_XMM0_Dd_00;
                ImFormatString(buf_1,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                               SUB84((double)IVar41.Min.x,0),SUB84((double)IVar41.Min.y,0),
                               SUB84((double)IVar41.Max.x,0),(double)IVar41.Max.y,
                               (double)(IVar41.Max.x - IVar41.Min.x),
                               (double)(IVar41.Max.y - IVar41.Min.y),trt_rects_names[uVar22]);
                local_1b8.x = 0.0;
                local_1b8.y = 0.0;
                Selectable(buf_1,false,0,&local_1b8);
                bVar12 = IsItemHovered(0);
                if (bVar12) {
                  pIVar15 = GetForegroundDrawList();
                  local_1b8.y = (float)local_1a8._4_4_ + -1.0;
                  local_1b8.x = (float)local_1a8._0_4_ + -1.0;
                  local_180.y = (float)local_198._4_4_ + 1.0;
                  local_180.x = (float)local_198._0_4_ + 1.0;
                  uVar36 = 0;
                  uVar37 = 0;
                  ImDrawList::AddRect(pIVar15,&local_1b8,&local_180,0xff00ffff,0.0,0,2.0);
                }
              }
              else if (((iVar13 == 8) || (iVar13 == 6)) && (0 < pIVar14->ColumnsCount)) {
                uVar23 = 0;
                do {
                  IVar41 = ShowMetricsWindow::Funcs::GetTableRect(pIVar14,iVar13,(int)uVar23);
                  local_198._0_8_ = IVar41.Max;
                  local_198._8_4_ = uVar36;
                  local_198._12_4_ = uVar37;
                  uVar36 = 0;
                  uVar37 = 0;
                  fStack_1a0 = (float)extraout_XMM0_Dc;
                  local_1a8._0_4_ = IVar41.Min.x;
                  local_1a8._4_4_ = IVar41.Min.y;
                  fStack_19c = (float)extraout_XMM0_Dd;
                  ImFormatString(buf_1,0x80,
                                 "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",
                                 SUB84((double)IVar41.Min.x,0),SUB84((double)IVar41.Min.y,0),
                                 SUB84((double)IVar41.Max.x,0),(double)IVar41.Max.y,
                                 (double)(IVar41.Max.x - IVar41.Min.x),
                                 (double)(IVar41.Max.y - IVar41.Min.y),uVar23);
                  local_1b8.x = 0.0;
                  local_1b8.y = 0.0;
                  Selectable(buf_1,false,0,&local_1b8);
                  bVar12 = IsItemHovered(0);
                  if (bVar12) {
                    pIVar15 = GetForegroundDrawList();
                    local_1b8.y = (float)local_1a8._4_4_ + -1.0;
                    local_1b8.x = (float)local_1a8._0_4_ + -1.0;
                    local_180.y = (float)local_198._4_4_ + 1.0;
                    local_180.x = (float)local_198._0_4_ + 1.0;
                    uVar36 = 0;
                    uVar37 = 0;
                    ImDrawList::AddRect(pIVar15,&local_1b8,&local_180,0xff00ffff,0.0,0,2.0);
                  }
                  uVar30 = (int)uVar23 + 1;
                  uVar23 = (ulong)uVar30;
                } while ((int)uVar30 < pIVar14->ColumnsCount);
              }
              pIVar11 = GImGui;
              uVar22 = uVar22 + 1;
            } while (uVar22 != 0xd);
            pIVar18 = GImGui->CurrentWindow;
            pIVar18->WriteAccessed = true;
            fVar33 = (pIVar18->DC).Indent.x - (pIVar11->Style).IndentSpacing;
            (pIVar18->DC).Indent.x = fVar33;
            (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
            this = (ImPool<ImGuiTable> *)local_178._0_8_;
            IVar31 = local_168._0_4_;
          }
        }
        IVar31 = IVar31 + 1;
      } while (IVar31 < (pIVar10->Tables).Map.Data.Size);
    }
    TreePop();
  }
  local_198._0_8_ = &pIVar10->Windows;
  uVar22 = 0;
  bVar12 = TreeNode("Windows","Windows (%d)",(ulong)(uint)(pIVar10->Windows).Size);
  if (bVar12) {
    DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)local_198._0_8_,"By display order");
    DebugNodeWindowsList(&pIVar10->WindowsFocusOrder,"By focus order (root windows)");
    bVar12 = TreeNode("By submission order (begin stack)");
    if (bVar12) {
      if ((pIVar10->WindowsTempSortBuffer).Capacity < 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + 1;
        }
        ppIVar16 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        ppIVar27 = (pIVar10->WindowsTempSortBuffer).Data;
        if (ppIVar27 != (ImGuiWindow **)0x0) {
          memcpy(ppIVar16,ppIVar27,(long)(pIVar10->WindowsTempSortBuffer).Size << 3);
          ppIVar27 = (pIVar10->WindowsTempSortBuffer).Data;
          if ((ppIVar27 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar2 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar2 = *piVar2 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar27,GImAllocatorUserData);
        }
        (pIVar10->WindowsTempSortBuffer).Data = ppIVar16;
        (pIVar10->WindowsTempSortBuffer).Capacity = 0;
      }
      (pIVar10->WindowsTempSortBuffer).Size = 0;
      iVar13 = (pIVar10->Windows).Size;
      if (iVar13 < 1) {
        ppIVar27 = (pIVar10->WindowsTempSortBuffer).Data;
        uVar30 = 0;
      }
      else {
        uVar23 = 0;
        lVar17 = 0;
        do {
          iVar28 = (int)uVar23;
          ppIVar27 = (pIVar10->Windows).Data;
          pIVar18 = ppIVar27[lVar17];
          if (pIVar10->FrameCount <= pIVar18->LastFrameActive + 1) {
            if (iVar28 == (pIVar10->WindowsTempSortBuffer).Capacity) {
              if (iVar28 == 0) {
                iVar13 = 8;
              }
              else {
                iVar13 = ((int)(uVar23 >> 0x1f) + iVar28 >> 1) + iVar28;
              }
              iVar9 = iVar28 + 1;
              if (iVar28 + 1 < iVar13) {
                iVar9 = iVar13;
              }
              if (GImGui != (ImGuiContext *)0x0) {
                piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar2 = *piVar2 + 1;
              }
              ppIVar16 = (ImGuiWindow **)
                         (*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
              ppIVar5 = (pIVar10->WindowsTempSortBuffer).Data;
              if (ppIVar5 != (ImGuiWindow **)0x0) {
                memcpy(ppIVar16,ppIVar5,(long)(pIVar10->WindowsTempSortBuffer).Size << 3);
                ppIVar5 = (pIVar10->WindowsTempSortBuffer).Data;
                if ((ppIVar5 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                  piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar2 = *piVar2 + -1;
                }
                (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
              }
              (pIVar10->WindowsTempSortBuffer).Data = ppIVar16;
              (pIVar10->WindowsTempSortBuffer).Capacity = iVar9;
              iVar28 = (pIVar10->WindowsTempSortBuffer).Size;
              pIVar18 = ppIVar27[lVar17];
            }
            else {
              ppIVar16 = (pIVar10->WindowsTempSortBuffer).Data;
            }
            ppIVar16[iVar28] = pIVar18;
            iVar13 = (pIVar10->Windows).Size;
            uVar30 = (pIVar10->WindowsTempSortBuffer).Size + 1;
            uVar23 = (ulong)uVar30;
            (pIVar10->WindowsTempSortBuffer).Size = uVar30;
          }
          uVar30 = (uint)uVar23;
          lVar17 = lVar17 + 1;
        } while (lVar17 < iVar13);
        ppIVar27 = (pIVar10->WindowsTempSortBuffer).Data;
        if (1 < uVar30) {
          qsort(ppIVar27,(long)(int)uVar30,8,ShowMetricsWindow::Func::WindowComparerByBeginOrder);
          ppIVar27 = (pIVar10->WindowsTempSortBuffer).Data;
          uVar30 = (pIVar10->WindowsTempSortBuffer).Size;
        }
      }
      DebugNodeWindowsListByBeginStackParent(ppIVar27,uVar30,(ImGuiWindow *)0x0);
      TreePop();
    }
    TreePop();
  }
  lVar17 = (long)(pIVar10->Viewports).Size;
  if (0 < lVar17) {
    lVar20 = 0;
    uVar22 = 0;
    do {
      pIVar6 = (pIVar10->Viewports).Data[lVar20];
      uVar22 = (ulong)(uint)((int)uVar22 + (pIVar6->DrawDataBuilder).Layers[0].Size +
                            (pIVar6->DrawDataBuilder).Layers[1].Size);
      lVar20 = lVar20 + 1;
    } while (lVar17 != lVar20);
  }
  bVar12 = TreeNode("DrawLists","DrawLists (%d)",uVar22);
  if (bVar12) {
    Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar10->DebugMetricsConfig).ShowDrawCmdMesh);
    Checkbox("Show ImDrawCmd bounding boxes when hovering",
             &(pIVar10->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
    if (0 < (pIVar10->Viewports).Size) {
      lVar17 = 0;
      do {
        pIVar6 = (pIVar10->Viewports).Data[lVar17];
        lVar20 = 0;
        bVar12 = true;
        do {
          bVar24 = bVar12;
          if (0 < (pIVar6->DrawDataBuilder).Layers[lVar20].Size) {
            pIVar29 = (pIVar6->DrawDataBuilder).Layers + lVar20;
            lVar20 = 0;
            do {
              DebugNodeDrawList((ImGuiWindow *)0x0,pIVar29->Data[lVar20],"DrawList");
              lVar20 = lVar20 + 1;
            } while (lVar20 < pIVar29->Size);
          }
          lVar20 = 1;
          bVar12 = false;
        } while (bVar24);
        lVar17 = lVar17 + 1;
      } while (lVar17 < (pIVar10->Viewports).Size);
    }
    TreePop();
  }
  bVar12 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar10->Viewports).Size);
  if (bVar12) {
    fVar33 = GetTreeNodeToLabelSpacing();
    pIVar11 = GImGui;
    pIVar18 = GImGui->CurrentWindow;
    pIVar18->WriteAccessed = true;
    fVar38 = extraout_XMM0_Db;
    if ((fVar33 == 0.0) && (!NAN(fVar33))) {
      fVar33 = (pIVar11->Style).IndentSpacing;
      fVar38 = 0.0;
    }
    fVar33 = fVar33 + (pIVar18->DC).Indent.x;
    (pIVar18->DC).Indent.x = fVar33;
    fVar33 = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
    (pIVar18->DC).CursorPos.x = fVar33;
    lVar17 = (long)(pIVar11->Viewports).Size;
    if (lVar17 < 1) {
      buf_1._0_4_ = -INFINITY;
      buf_1._4_4_ = -INFINITY;
    }
    else {
      lVar20 = 0;
      local_168 = _DAT_001a7710;
      local_178 = _DAT_001a7660;
      do {
        pIVar6 = (pIVar11->Viewports).Data[lVar20];
        IVar3 = (pIVar6->super_ImGuiViewport).Pos;
        auVar40._8_8_ = 0;
        auVar40._0_4_ = IVar3.x;
        auVar40._4_4_ = IVar3.y;
        IVar4 = (pIVar6->super_ImGuiViewport).Size;
        auVar39._0_4_ = IVar4.x + IVar3.x;
        auVar39._4_4_ = IVar4.y + IVar3.y;
        auVar39._8_8_ = 0;
        local_168 = maxps(auVar39,local_168);
        local_178 = minps(auVar40,local_178);
        lVar20 = lVar20 + 1;
      } while (lVar17 != lVar20);
      local_1a8._0_4_ = fVar33 + local_178._0_4_ * -0.125;
      local_1a8._4_4_ = (pIVar18->DC).CursorPos.y + local_178._4_4_ * -0.125;
      lVar17 = 0;
      fStack_1a0 = fVar38 + local_178._8_4_ * 0.0;
      fStack_19c = local_178._12_4_ * 0.0 + 0.0;
      fVar33 = (float)local_1a8._0_4_;
      fVar38 = (float)local_1a8._4_4_;
      do {
        pIVar6 = (pIVar11->Viewports).Data[lVar17];
        IVar3 = (pIVar6->super_ImGuiViewport).Pos;
        fVar34 = IVar3.x;
        fVar35 = IVar3.y;
        IVar3 = (pIVar6->super_ImGuiViewport).Size;
        buf_1._4_4_ = fVar35 * 0.125 + fVar38;
        buf_1._0_4_ = fVar34 * 0.125 + fVar33;
        buf_1._8_4_ = (IVar3.x + fVar34) * 0.125 + fVar33;
        buf_1._12_4_ = (IVar3.y + fVar35) * 0.125 + fVar38;
        DebugRenderViewportThumbnail(pIVar18->DrawList,pIVar6,(ImRect *)buf_1);
        lVar17 = lVar17 + 1;
        fVar33 = (float)local_1a8._0_4_;
        fVar38 = (float)local_1a8._4_4_;
      } while (lVar17 < (pIVar11->Viewports).Size);
      buf_1._0_4_ = ((float)local_168._0_4_ - (float)local_178._0_4_) * 0.125;
      buf_1._4_4_ = ((float)local_168._4_4_ - (float)local_178._4_4_) * 0.125;
    }
    Dummy((ImVec2 *)buf_1);
    fVar33 = GetTreeNodeToLabelSpacing();
    pIVar11 = GImGui;
    pIVar18 = GImGui->CurrentWindow;
    pIVar18->WriteAccessed = true;
    if ((fVar33 == 0.0) && (!NAN(fVar33))) {
      fVar33 = (pIVar11->Style).IndentSpacing;
    }
    fVar33 = (pIVar18->DC).Indent.x - fVar33;
    (pIVar18->DC).Indent.x = fVar33;
    (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
    if (0 < (pIVar10->Viewports).Size) {
      lVar17 = 0;
      do {
        DebugNodeViewport((pIVar10->Viewports).Data[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 < (pIVar10->Viewports).Size);
    }
    TreePop();
  }
  bVar12 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar10->OpenPopupStack).Size);
  if (bVar12) {
    if (0 < (pIVar10->OpenPopupStack).Size) {
      lVar20 = 8;
      lVar17 = 0;
      do {
        pIVar7 = (pIVar10->OpenPopupStack).Data;
        puVar8 = *(undefined8 **)((long)&pIVar7->PopupId + lVar20);
        pcVar19 = "";
        pcVar21 = "NULL";
        if (puVar8 != (undefined8 *)0x0) {
          pcVar21 = (char *)*puVar8;
          pcVar19 = " ChildWindow";
          if ((*(uint *)((long)puVar8 + 0xc) >> 0x18 & 1) == 0) {
            pcVar19 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)*(uint *)((long)pIVar7 + lVar20 + -8),
                   pcVar21,pcVar19);
        lVar17 = lVar17 + 1;
        lVar20 = lVar20 + 0x38;
      } while (lVar17 < (pIVar10->OpenPopupStack).Size);
    }
    TreePop();
  }
  bVar12 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar10->TabBars).AliveCount);
  if (bVar12) {
    if (0 < (pIVar10->TabBars).Map.Data.Size) {
      IVar31 = 0;
      do {
        tab_bar = ImPool<ImGuiTabBar>::TryGetMapData(&pIVar10->TabBars,IVar31);
        if (tab_bar != (ImGuiTabBar *)0x0) {
          PushID(tab_bar);
          DebugNodeTabBar(tab_bar,"TabBar");
          PopID();
        }
        IVar31 = IVar31 + 1;
      } while (IVar31 < (pIVar10->TabBars).Map.Data.Size);
    }
    TreePop();
  }
  bVar12 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar10->Tables).AliveCount);
  if (bVar12) {
    if (0 < (pIVar10->Tables).Map.Data.Size) {
      iVar13 = 0;
      do {
        pIVar14 = ImPool<ImGuiTable>::TryGetMapData(&pIVar10->Tables,iVar13);
        if (pIVar14 != (ImGuiTable *)0x0) {
          DebugNodeTable(pIVar14);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < (pIVar10->Tables).Map.Data.Size);
    }
    TreePop();
  }
  atlas = (pIVar10->IO).Fonts;
  bVar12 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(atlas->Fonts).Size);
  if (bVar12) {
    ShowFontAtlas(atlas);
    TreePop();
  }
  bVar12 = TreeNode("InputText");
  if (bVar12) {
    DebugNodeInputTextState(&pIVar10->InputTextState);
    TreePop();
  }
  local_1a8 = (undefined1  [8])&pIVar10->Tables;
  bVar12 = TreeNode("Settings");
  if (bVar12) {
    bVar12 = SmallButton("Clear");
    if (bVar12) {
      ClearIniSettings();
    }
    pIVar18 = GImGui->CurrentWindow;
    if (pIVar18->SkipItems == false) {
      (pIVar18->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar18->DC).CursorPosPrevLine.x;
      (pIVar18->DC).CursorPos.y = (pIVar18->DC).CursorPosPrevLine.y;
      (pIVar18->DC).CurrLineSize = (pIVar18->DC).PrevLineSize;
      (pIVar18->DC).CurrLineTextBaseOffset = (pIVar18->DC).PrevLineTextBaseOffset;
      (pIVar18->DC).IsSameLine = true;
    }
    bVar12 = SmallButton("Save to memory");
    if (bVar12) {
      SaveIniSettingsToMemory((size_t *)0x0);
    }
    pIVar18 = GImGui->CurrentWindow;
    if (pIVar18->SkipItems == false) {
      (pIVar18->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar18->DC).CursorPosPrevLine.x;
      (pIVar18->DC).CursorPos.y = (pIVar18->DC).CursorPosPrevLine.y;
      (pIVar18->DC).CurrLineSize = (pIVar18->DC).PrevLineSize;
      (pIVar18->DC).CurrLineTextBaseOffset = (pIVar18->DC).PrevLineTextBaseOffset;
      (pIVar18->DC).IsSameLine = true;
    }
    bVar12 = SmallButton("Save to disk");
    if (bVar12) {
      SaveIniSettingsToDisk((pIVar10->IO).IniFilename);
    }
    pIVar18 = GImGui->CurrentWindow;
    if (pIVar18->SkipItems == false) {
      (pIVar18->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar18->DC).CursorPosPrevLine.x;
      (pIVar18->DC).CursorPos.y = (pIVar18->DC).CursorPosPrevLine.y;
      (pIVar18->DC).CurrLineSize = (pIVar18->DC).PrevLineSize;
      (pIVar18->DC).CurrLineTextBaseOffset = (pIVar18->DC).PrevLineTextBaseOffset;
      (pIVar18->DC).IsSameLine = true;
    }
    if ((pIVar10->IO).IniFilename == (char *)0x0) {
      TextUnformatted("<NULL>",(char *)0x0);
    }
    else {
      Text("\"%s\"");
    }
    Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar10->SettingsDirtyTimer,0));
    bVar12 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                      (ulong)(uint)(pIVar10->SettingsHandlers).Size);
    if (bVar12) {
      if (0 < (pIVar10->SettingsHandlers).Size) {
        lVar17 = 0;
        lVar20 = 0;
        do {
          BulletText("%s",*(undefined8 *)
                           ((long)&((pIVar10->SettingsHandlers).Data)->TypeName + lVar17));
          lVar20 = lVar20 + 1;
          lVar17 = lVar17 + 0x48;
        } while (lVar20 < (pIVar10->SettingsHandlers).Size);
      }
      TreePop();
    }
    bVar12 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                      (ulong)(uint)(pIVar10->SettingsWindows).Buf.Size);
    if (bVar12) {
      pcVar21 = (pIVar10->SettingsWindows).Buf.Data;
      if (pcVar21 != (char *)0x0) {
        p = (ImGuiWindowSettings *)(pcVar21 + 4);
        do {
          Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)p->ID,p + 1,
               (ulong)(uint)(int)(p->Pos).x,(ulong)(uint)(int)(p->Pos).y,
               (ulong)(uint)(int)(p->Size).x,(ulong)(uint)(int)(p->Size).y,(ulong)p->Collapsed);
          p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&pIVar10->SettingsWindows,p);
        } while (p != (ImGuiWindowSettings *)0x0);
      }
      TreePop();
    }
    bVar12 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                      (ulong)(uint)(pIVar10->SettingsTables).Buf.Size);
    if (bVar12) {
      pcVar21 = (pIVar10->SettingsTables).Buf.Data;
      if (pcVar21 != (char *)0x0) {
        settings = (ImGuiTableSettings *)(pcVar21 + 4);
        do {
          DebugNodeTableSettings(settings);
          settings = ImChunkStream<ImGuiTableSettings>::next_chunk
                               (&pIVar10->SettingsTables,settings);
        } while (settings != (ImGuiTableSettings *)0x0);
      }
      TreePop();
    }
    iVar13 = (pIVar10->SettingsIniData).Buf.Size;
    uVar22 = (ulong)(iVar13 - 1);
    if (iVar13 == 0) {
      uVar22 = 0;
    }
    bVar12 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar22);
    if (bVar12) {
      pcVar21 = (pIVar10->SettingsIniData).Buf.Data;
      pcVar19 = ImGuiTextBuffer::EmptyString;
      if (pcVar21 != (char *)0x0) {
        pcVar19 = pcVar21;
      }
      buf_1._4_4_ = GImGui->FontSize * 20.0;
      buf_1[0] = '\0';
      buf_1[1] = '\0';
      buf_1[2] = -0x80;
      buf_1[3] = -0x80;
      InputTextMultiline("##Ini",pcVar19,(long)(pIVar10->SettingsIniData).Buf.Size,(ImVec2 *)buf_1,
                         0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
      TreePop();
    }
    TreePop();
  }
  bVar12 = TreeNode("Internal state");
  if (bVar12) {
    Text("WINDOWING");
    pIVar11 = GImGui;
    pIVar18 = GImGui->CurrentWindow;
    pIVar18->WriteAccessed = true;
    fVar33 = (pIVar11->Style).IndentSpacing + (pIVar18->DC).Indent.x;
    (pIVar18->DC).Indent.x = fVar33;
    (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
    pcVar19 = "NULL";
    pcVar21 = "NULL";
    if (pIVar10->HoveredWindow != (ImGuiWindow *)0x0) {
      pcVar21 = pIVar10->HoveredWindow->Name;
    }
    Text("HoveredWindow: \'%s\'",pcVar21);
    pcVar21 = "NULL";
    if (pIVar10->HoveredWindow != (ImGuiWindow *)0x0) {
      pcVar21 = pIVar10->HoveredWindow->RootWindow->Name;
    }
    Text("HoveredWindow->Root: \'%s\'",pcVar21);
    pcVar21 = "NULL";
    if (pIVar10->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
      pcVar21 = pIVar10->HoveredWindowUnderMovingWindow->Name;
    }
    Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar21);
    if (pIVar10->MovingWindow != (ImGuiWindow *)0x0) {
      pcVar19 = pIVar10->MovingWindow->Name;
    }
    Text("MovingWindow: \'%s\'",pcVar19);
    pIVar11 = GImGui;
    pIVar18 = GImGui->CurrentWindow;
    pIVar18->WriteAccessed = true;
    fVar33 = (pIVar18->DC).Indent.x - (pIVar11->Style).IndentSpacing;
    (pIVar18->DC).Indent.x = fVar33;
    (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
    Text("ITEMS");
    pIVar11 = GImGui;
    pIVar18 = GImGui->CurrentWindow;
    pIVar18->WriteAccessed = true;
    fVar33 = (pIVar11->Style).IndentSpacing + (pIVar18->DC).Indent.x;
    (pIVar18->DC).Indent.x = fVar33;
    (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
    if ((ulong)pIVar10->ActiveIdSource < 6) {
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar10->ActiveIdTimer,0),(ulong)pIVar10->ActiveId,
           (ulong)pIVar10->ActiveIdPreviousFrame,(ulong)pIVar10->ActiveIdAllowOverlap,
           *(undefined8 *)(&DAT_001e13e0 + (ulong)pIVar10->ActiveIdSource * 8));
      if (pIVar10->ActiveIdWindow == (ImGuiWindow *)0x0) {
        pcVar21 = "NULL";
      }
      else {
        pcVar21 = pIVar10->ActiveIdWindow->Name;
      }
      uVar30 = 0;
      Text("ActiveIdWindow: \'%s\'",pcVar21);
      iVar13 = 0x200;
      do {
        bVar12 = ImBitArray<133,_-512>::operator[](&pIVar10->ActiveIdUsingKeyInputMask,iVar13);
        uVar30 = uVar30 + bVar12;
        iVar13 = iVar13 + 1;
      } while (iVar13 != 0x285);
      Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)",
           (ulong)pIVar10->ActiveIdUsingMouseWheel,(ulong)pIVar10->ActiveIdUsingNavDirMask,
           (ulong)pIVar10->ActiveIdUsingNavInputMask,(ulong)uVar30);
      Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d",SUB84((double)pIVar10->HoveredIdTimer,0)
           ,(ulong)pIVar10->HoveredIdPreviousFrame,(ulong)pIVar10->HoveredIdAllowOverlap);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar10->DragDropActive,(ulong)(pIVar10->DragDropPayload).SourceId,
           (pIVar10->DragDropPayload).DataType,(ulong)(uint)(pIVar10->DragDropPayload).DataSize);
      pIVar11 = GImGui;
      pIVar18 = GImGui->CurrentWindow;
      pIVar18->WriteAccessed = true;
      fVar33 = (pIVar18->DC).Indent.x - (pIVar11->Style).IndentSpacing;
      (pIVar18->DC).Indent.x = fVar33;
      (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
      Text("NAV,FOCUS");
      pIVar11 = GImGui;
      pIVar18 = GImGui->CurrentWindow;
      pIVar18->WriteAccessed = true;
      fVar33 = (pIVar11->Style).IndentSpacing + (pIVar18->DC).Indent.x;
      (pIVar18->DC).Indent.x = fVar33;
      (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
      if (pIVar10->NavWindow == (ImGuiWindow *)0x0) {
        pcVar21 = "NULL";
      }
      else {
        pcVar21 = pIVar10->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar21);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar10->NavId,(ulong)pIVar10->NavLayer);
      if ((ulong)pIVar10->NavInputSource < 6) {
        Text("NavInputSource: %s",
             *(undefined8 *)(&DAT_001e13e0 + (ulong)pIVar10->NavInputSource * 8));
        Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar10->IO).NavActive,
             (ulong)(pIVar10->IO).NavVisible);
        Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X",
             (ulong)pIVar10->NavActivateId,(ulong)pIVar10->NavActivateDownId,
             (ulong)pIVar10->NavActivatePressedId);
        Text("NavActivateFlags: %04X",(ulong)(uint)pIVar10->NavActivateFlags);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar10->NavDisableHighlight
             ,(ulong)pIVar10->NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X",(ulong)pIVar10->NavFocusScopeId);
        if (pIVar10->NavWindowingTarget == (ImGuiWindow *)0x0) {
          pcVar21 = "NULL";
        }
        else {
          pcVar21 = pIVar10->NavWindowingTarget->Name;
        }
        Text("NavWindowingTarget: \'%s\'",pcVar21);
        pIVar11 = GImGui;
        pIVar18 = GImGui->CurrentWindow;
        pIVar18->WriteAccessed = true;
        fVar33 = (pIVar18->DC).Indent.x - (pIVar11->Style).IndentSpacing;
        (pIVar18->DC).Indent.x = fVar33;
        (pIVar18->DC).CursorPos.x = fVar33 + (pIVar18->Pos).x + (pIVar18->DC).ColumnsOffset.x;
        TreePop();
        goto LAB_00144610;
      }
    }
    __assert_fail("((int)(sizeof(input_source_names) / sizeof(*(input_source_names)))) == ImGuiInputSource_COUNT && source >= 0 && source < ImGuiInputSource_COUNT"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1ea9,"const char *GetInputSourceName(ImGuiInputSource)");
  }
LAB_00144610:
  if ((((pIVar10->DebugMetricsConfig).ShowWindowsRects != false) ||
      ((pIVar10->DebugMetricsConfig).ShowWindowsBeginOrder == true)) &&
     (0 < *(int *)local_198._0_8_)) {
    lVar17 = 0;
    do {
      pIVar18 = (pIVar10->Windows).Data[lVar17];
      if (pIVar18->WasActive == true) {
        pIVar15 = GetForegroundDrawList();
        if ((pIVar10->DebugMetricsConfig).ShowWindowsRects == true) {
          buf_1._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetWindowRect(pIVar18,*local_188);
          ImDrawList::AddRect(pIVar15,(ImVec2 *)buf_1,(ImVec2 *)(buf_1 + 8),0xff8000ff,0.0,0,1.0);
        }
        if (((pIVar10->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
           ((pIVar18->Flags & 0x1000000) == 0)) {
          ImFormatString(buf_1,0x20,"%d",(ulong)(uint)(int)pIVar18->BeginOrderWithinContext);
          local_1b8.y = GImGui->FontSize + (pIVar18->Pos).y;
          local_1b8.x = GImGui->FontSize + (pIVar18->Pos).x;
          ImDrawList::AddRectFilled(pIVar15,&pIVar18->Pos,&local_1b8,0xff6464c8,0.0,0);
          ImDrawList::AddText(pIVar15,&pIVar18->Pos,0xffffffff,buf_1,(char *)0x0);
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < *(int *)local_198._0_8_);
  }
  if (((pIVar10->DebugMetricsConfig).ShowTablesRects == true) &&
     (0 < (pIVar10->Tables).Map.Data.Size)) {
    iVar13 = 0;
    do {
      pIVar14 = ImPool<ImGuiTable>::TryGetMapData((ImPool<ImGuiTable> *)local_1a8,iVar13);
      if ((pIVar14 != (ImGuiTable *)0x0) && (pIVar10->FrameCount + -1 <= pIVar14->LastFrameActive))
      {
        pIVar15 = GetForegroundDrawList();
        if (*local_1b0 < 6) {
          buf_1._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetTableRect(pIVar14,*local_1b0,-1);
          ImDrawList::AddRect(pIVar15,(ImVec2 *)buf_1,(ImVec2 *)(buf_1 + 8),0xff8000ff,0.0,0,1.0);
        }
        else if (0 < pIVar14->ColumnsCount) {
          iVar28 = 0;
          do {
            buf_1._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetTableRect(pIVar14,*local_1b0,iVar28);
            bVar12 = iVar28 == pIVar14->HoveredColumnBody;
            col = 0xff8000ff;
            if (bVar12) {
              col = 0xff80ffff;
            }
            ImDrawList::AddRect(pIVar15,(ImVec2 *)buf_1,(ImVec2 *)(buf_1 + 8),col,0.0,0,
                                *(float *)(&DAT_001a83d8 + (ulong)bVar12 * 4));
            iVar28 = iVar28 + 1;
          } while (iVar28 < pIVar14->ColumnsCount);
        }
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (pIVar10->Tables).Map.Data.Size);
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    if (cfg->ShowDebugLog)
        ShowDebugLogWindow(&cfg->ShowDebugLog);
    if (cfg->ShowStackTool)
        ShowStackToolWindow(&cfg->ShowStackTool);

    if (!Begin("Dear ImGui Metrics/Debugger", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d visible windows, %d active allocations", io.MetricsRenderWindows, io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent); // Always using last submitted instance
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table_instance->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        bool show_encoding_viewer = TreeNode("UTF-8 Encoding viewer");
        SameLine();
        MetricsHelpMarker("You can also call ImGui::DebugTextEncoding() from your code with a given string to test that your UTF-8 encoding settings are correct.");
        if (show_encoding_viewer)
        {
            static char buf[100] = "";
            SetNextItemWidth(-FLT_MIN);
            InputText("##Text", buf, IM_ARRAYSIZE(buf));
            if (buf[0] != 0)
                DebugTextEncoding(buf);
            TreePop();
        }

        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Checkbox("Show Item Picker", &g.DebugItemPickerActive) && g.DebugItemPickerActive)
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        // Stack Tool is your best friend!
        Checkbox("Show Debug Log", &cfg->ShowDebugLog);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowDebugLogWindow() from your code.");

        // Stack Tool is your best friend!
        Checkbox("Show Stack Tool", &cfg->ShowStackTool);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetMapData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    if (TreeNode("Windows", "Windows (%d)", g.Windows.Size))
    {
        //SetNextItemOpen(true, ImGuiCond_Once);
        DebugNodeWindowsList(&g.Windows, "By display order");
        DebugNodeWindowsList(&g.WindowsFocusOrder, "By focus order (root windows)");
        if (TreeNode("By submission order (begin stack)"))
        {
            // Here we display windows in their submitted order/hierarchy, however note that the Begin stack doesn't constitute a Parent<>Child relationship!
            ImVector<ImGuiWindow*>& temp_buffer = g.WindowsTempSortBuffer;
            temp_buffer.resize(0);
            for (int i = 0; i < g.Windows.Size; i++)
                if (g.Windows[i]->LastFrameActive + 1 >= g.FrameCount)
                    temp_buffer.push_back(g.Windows[i]);
            struct Func { static int IMGUI_CDECL WindowComparerByBeginOrder(const void* lhs, const void* rhs) { return ((int)(*(const ImGuiWindow* const *)lhs)->BeginOrderWithinContext - (*(const ImGuiWindow* const*)rhs)->BeginOrderWithinContext); } };
            ImQsort(temp_buffer.Data, (size_t)temp_buffer.Size, sizeof(ImGuiWindow*), Func::WindowComparerByBeginOrder);
            DebugNodeWindowsListByBeginStackParent(temp_buffer.Data, temp_buffer.Size, NULL);
            TreePop();
        }

        TreePop();
    }

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetMapSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetMapData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetMapSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetMapData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }

    // Details for InputText
    if (TreeNode("InputText"))
    {
        DebugNodeInputTextState(&g.InputTextState);
        TreePop();
    }

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, GetInputSourceName(g.ActiveIdSource));
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");

        int active_id_using_key_input_count = 0;
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            active_id_using_key_input_count += g.ActiveIdUsingKeyInputMask[n] ? 1 : 0;
        Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)", g.ActiveIdUsingMouseWheel, g.ActiveIdUsingNavDirMask, g.ActiveIdUsingNavInputMask, active_id_using_key_input_count);
        Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Not displaying g.HoveredId as it is update mid-frame
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", GetInputSourceName(g.NavInputSource));
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X", g.NavActivateId, g.NavActivateDownId, g.NavActivatePressedId, g.NavActivateInputId);
        Text("NavActivateFlags: %04X", g.NavActivateFlags);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetMapData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}